

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O1

bool __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::readMPS(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *this,istream *p_input,NameSet *p_rnames,NameSet *p_cnames,DIdxSet *p_intvars)

{
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar1;
  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  DataKey *pDVar2;
  uint *puVar3;
  undefined8 *puVar4;
  char cVar5;
  undefined8 uVar6;
  ostream *poVar7;
  _func_int **pp_Var8;
  undefined8 uVar9;
  undefined8 uVar10;
  int32_t iVar11;
  undefined1 auVar12 [16];
  NameSet *pNVar13;
  bool bVar14;
  int iVar15;
  int i;
  int iVar16;
  uint uVar17;
  char *pcVar18;
  cpp_dec_float<50U,_int,_void> *pcVar19;
  size_t sVar20;
  ulong uVar21;
  pointer pnVar22;
  SPxOut *pSVar23;
  int __c;
  long in_FS_OFFSET;
  double dVar24;
  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *rset;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  val_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  val;
  NameSet *rnames;
  Verbosity old_verbosity;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  vec;
  char colname [256];
  MPSInput mps;
  undefined1 local_6a8 [16];
  _func_int *local_698;
  uint uStack_690;
  undefined3 uStack_68b;
  uint local_688;
  undefined3 uStack_683;
  int local_680;
  bool local_67c;
  undefined8 local_678;
  undefined1 local_668 [16];
  _func_int *local_658;
  undefined5 uStack_650;
  undefined3 uStack_64b;
  uint local_648 [3];
  bool local_63c;
  undefined8 local_638;
  SPxOut *local_630;
  NameSet *local_628;
  NameSet *local_620;
  NameSet *local_618;
  undefined8 uStack_610;
  NameSet *local_608;
  undefined8 uStack_600;
  DIdxSet *local_5f0;
  undefined1 local_5e8 [16];
  _func_int *local_5d8;
  uint uStack_5d0;
  undefined3 uStack_5cb;
  _func_int *local_5c8;
  int local_5c0;
  bool local_5bc;
  undefined8 local_5b8;
  uint local_5b0 [2];
  uint auStack_5a8 [2];
  uint local_5a0 [2];
  uint auStack_598 [2];
  uint local_590 [2];
  int local_588;
  bool local_584;
  undefined8 local_580;
  _func_int **local_578;
  int iStack_570;
  int iStack_56c;
  _func_int *local_568;
  uint auStack_560 [2];
  uint local_558 [2];
  int local_550;
  bool local_54c;
  fpclass_type local_548;
  int32_t iStack_544;
  _func_int **local_540 [3];
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_528;
  undefined1 local_4e8 [8];
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_4e0;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_4d0;
  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_4c8;
  NameSet *local_4c0;
  NameSet *local_4b8;
  SPxOut *local_4b0;
  undefined1 local_4a8 [24];
  uint auStack_490 [2];
  _func_int *local_488;
  int local_480;
  bool local_47c;
  fpclass_type local_478;
  int32_t iStack_474;
  DataKey local_470;
  uint auStack_468 [2];
  _func_int *local_460;
  uint auStack_458 [2];
  _func_int *local_450;
  int local_448;
  bool local_444;
  fpclass_type local_440;
  int32_t iStack_43c;
  _func_int **local_400;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_3e8;
  undefined1 local_3a9;
  double local_3a8;
  undefined8 uStack_3a0;
  undefined1 local_390 [296];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  char local_238;
  char local_138 [256];
  undefined2 local_38;
  int local_34;
  
  local_5f0 = p_intvars;
  local_4c0 = p_cnames;
  if (p_cnames == (NameSet *)0x0) {
    local_628 = (NameSet *)0x0;
    spx_alloc<soplex::NameSet*>(&local_628,1);
    p_cnames = local_628;
    NameSet::NameSet(local_628,10000,-1,2.0,2.0);
  }
  local_628 = p_cnames;
  NameSet::clear(p_cnames);
  local_4b8 = p_rnames;
  if (p_rnames == (NameSet *)0x0) {
    local_620 = (NameSet *)0x0;
    spx_alloc<soplex::NameSet*>(&local_620,1);
    p_rnames = local_620;
    NameSet::NameSet(local_620,10000,-1,2.0,2.0);
  }
  this_00 = &this->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ;
  local_620 = p_rnames;
  NameSet::clear(p_rnames);
  clear(this);
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::memRemax(&this_00->
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ,100000);
  local_4c8 = this_00;
  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::reMax(this_00,10000);
  local_390._0_8_ = &PTR__MPSInput_006a9fa8;
  local_390._8_4_ = NAME;
  local_390._24_4_ = 0;
  local_390._28_4_ = MINIMIZE;
  local_390[0x20] = false;
  local_390[0x21] = '\0';
  local_38._0_1_ = false;
  local_38._1_1_ = false;
  local_34 = 0;
  local_138[0] = '\0';
  local_268 = (undefined1  [16])0x0;
  local_258 = (undefined1  [16])0x0;
  local_248 = (undefined1  [16])0x0;
  local_238 = '\0';
  local_390._16_8_ = p_input;
  MPSreadName((MPSInput *)local_390,this->spxout);
  if (local_390._8_4_ == OBJSEN) {
    MPSreadObjsen((MPSInput *)local_390);
  }
  if (local_390._8_4_ == OBJNAME) {
    bVar14 = MPSInput::readLine((MPSInput *)local_390);
    if ((bVar14) && ((char *)local_268._8_8_ != (char *)0x0)) {
      spxSnprintf(local_138,0x100,"%s");
      bVar14 = MPSInput::readLine((MPSInput *)local_390);
      if ((bVar14) &&
         (((char *)local_268._0_8_ != (char *)0x0 &&
          (iVar15 = strcmp((char *)local_268._0_8_,"ROWS"), iVar15 == 0)))) {
        local_390._8_4_ = ROWS;
        goto LAB_0021fa8f;
      }
    }
    MPSInput::syntaxError((MPSInput *)local_390);
  }
LAB_0021fa8f:
  pNVar13 = local_620;
  if (local_390._8_4_ == ROWS) {
    local_630 = this->spxout;
    LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::LPRowBase((LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)local_4a8,0);
    local_608 = *(NameSet **)(in_FS_OFFSET + -8);
    uStack_600 = 0;
    local_618 = (NameSet *)((ulong)local_608 ^ 0x8000000000000000);
    uStack_610 = 0x8000000000000000;
    while (bVar14 = MPSInput::readLine((MPSInput *)local_390), pSVar23 = local_630, bVar14) {
      if ((char *)local_268._0_8_ != (char *)0x0) {
        if ((local_630 != (SPxOut *)0x0) && (3 < (int)local_630->m_verbosity)) {
          local_5e8._0_4_ = local_630->m_verbosity;
          local_6a8._0_4_ = 4;
          (*local_630->_vptr_SPxOut[2])(local_630);
          std::__ostream_insert<char,std::char_traits<char>>
                    (pSVar23->m_streams[pSVar23->m_verbosity],"IMPSRD02 Objective name : ",0x1a);
          poVar7 = pSVar23->m_streams[pSVar23->m_verbosity];
          sVar20 = strlen(local_138);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_138,sVar20);
          cVar5 = (char)pSVar23->m_streams[pSVar23->m_verbosity];
          std::ios::widen((char)*(undefined8 *)
                                 (*(long *)pSVar23->m_streams[pSVar23->m_verbosity] + -0x18) + cVar5
                         );
          std::ostream::put(cVar5);
          std::ostream::flush();
          (*pSVar23->_vptr_SPxOut[2])(pSVar23,local_5e8);
        }
        iVar15 = strcmp((char *)local_268._0_8_,"COLUMNS");
        if (iVar15 == 0) {
          local_390._8_4_ = COLUMNS;
          goto LAB_0021ff16;
        }
        break;
      }
      if (((char *)local_268._8_8_ == (char *)0x0) || ((char *)local_258._0_8_ == (char *)0x0))
      break;
      if (*(char *)local_268._8_8_ == 'N') {
        if (local_138[0] == '\0') {
          spxSnprintf(local_138,0x100,"%s");
        }
      }
      else {
        local_5e8._0_8_ = local_258._0_8_;
        pcVar18 = DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::index
                            (&pNVar13->hashtab,(char *)local_5e8,__c);
        if (-1 < (int)pcVar18) break;
        NameSet::add(pNVar13,(char *)local_258._0_8_);
        cVar5 = *(char *)local_268._8_8_;
        if (cVar5 == 'E') {
          pcVar19 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
          local_480 = pcVar19->exp;
          local_47c = pcVar19->neg;
          local_4a8._0_4_ = (pcVar19->data)._M_elems[0];
          local_4a8._4_4_ = (pcVar19->data)._M_elems[1];
          local_4a8._8_8_ = *(undefined8 *)((pcVar19->data)._M_elems + 2);
          local_4a8._16_8_ = *(undefined8 *)((pcVar19->data)._M_elems + 4);
          auStack_490 = *(uint (*) [2])((pcVar19->data)._M_elems + 6);
          local_488 = *(_func_int **)((pcVar19->data)._M_elems + 8);
          local_478 = pcVar19->fpclass;
          iStack_474 = pcVar19->prec_elem;
          pcVar19 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
LAB_0021fdc8:
          local_448 = pcVar19->exp;
          local_444 = pcVar19->neg;
          local_440 = pcVar19->fpclass;
          iStack_43c = pcVar19->prec_elem;
          local_470.info = (pcVar19->data)._M_elems[0];
          local_470.idx = (pcVar19->data)._M_elems[1];
          auStack_468 = *(uint (*) [2])((pcVar19->data)._M_elems + 2);
          local_460 = *(_func_int **)((pcVar19->data)._M_elems + 4);
          auStack_458 = *(uint (*) [2])((pcVar19->data)._M_elems + 6);
          local_450 = *(_func_int **)((pcVar19->data)._M_elems + 8);
        }
        else {
          if (cVar5 == 'L') {
            ::soplex::infinity::__tls_init();
            local_5b8._0_4_ = cpp_dec_float_finite;
            local_5b8._4_4_ = 10;
            local_5e8 = (undefined1  [16])0x0;
            local_5d8 = (_func_int *)0x0;
            uStack_5d0._0_1_ = false;
            stack0xfffffffffffffa31 = 0;
            uStack_5cb = 0;
            local_5c8 = (_func_int *)0x0;
            local_5c0 = 0;
            local_5bc = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)local_5e8,(double)local_618);
            local_488 = local_5c8;
            auStack_490[1]._1_3_ = uStack_5cb;
            auStack_490[0]._0_1_ = uStack_5d0._0_1_;
            auStack_490._1_4_ = stack0xfffffffffffffa31;
            local_4a8._16_8_ = local_5d8;
            local_4a8._0_8_ = local_5e8._0_8_;
            local_4a8._8_8_ = local_5e8._8_8_;
            local_480 = local_5c0;
            local_47c = local_5bc;
            local_478 = (fpclass_type)local_5b8;
            iStack_474 = local_5b8._4_4_;
            pcVar19 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
            goto LAB_0021fdc8;
          }
          if (cVar5 != 'G') break;
          pcVar19 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
          local_480 = pcVar19->exp;
          local_47c = pcVar19->neg;
          local_4a8._0_4_ = (pcVar19->data)._M_elems[0];
          local_4a8._4_4_ = (pcVar19->data)._M_elems[1];
          local_4a8._8_8_ = *(undefined8 *)((pcVar19->data)._M_elems + 2);
          local_4a8._16_8_ = *(undefined8 *)((pcVar19->data)._M_elems + 4);
          auStack_490 = *(uint (*) [2])((pcVar19->data)._M_elems + 6);
          local_488 = *(_func_int **)((pcVar19->data)._M_elems + 8);
          local_478 = pcVar19->fpclass;
          iStack_474 = pcVar19->prec_elem;
          ::soplex::infinity::__tls_init();
          local_5b8._0_4_ = cpp_dec_float_finite;
          local_5b8._4_4_ = 10;
          local_5e8 = (undefined1  [16])0x0;
          local_5d8 = (_func_int *)0x0;
          uStack_5d0._0_1_ = false;
          stack0xfffffffffffffa31 = 0;
          uStack_5cb = 0;
          local_5c8 = (_func_int *)0x0;
          local_5c0 = 0;
          local_5bc = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)local_5e8,(double)local_608);
          local_450 = local_5c8;
          auStack_458[1]._1_3_ = uStack_5cb;
          auStack_458[0]._0_1_ = uStack_5d0._0_1_;
          auStack_458._1_4_ = stack0xfffffffffffffa31;
          local_460 = local_5d8;
          local_470.info = local_5e8._0_4_;
          local_470.idx = local_5e8._4_4_;
          auStack_468[0] = local_5e8._8_4_;
          auStack_468[1] = local_5e8._12_4_;
          local_448 = local_5c0;
          local_444 = local_5bc;
          local_440 = (fpclass_type)local_5b8;
          iStack_43c = local_5b8._4_4_;
        }
        local_5e8._0_8_ = 0xffffffff00000000;
        LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::add(&this->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ,(DataKey *)local_5e8,
              (LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)local_4a8);
      }
    }
    MPSInput::syntaxError((MPSInput *)local_390);
LAB_0021ff16:
    local_400 = (_func_int **)&PTR__DSVectorBase_006adc40;
    if (local_3e8 !=
        (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *)0x0) {
      free(local_3e8);
      local_3e8 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x0;
    }
  }
  (*(this->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x50])();
  if (local_390._8_4_ == COLUMNS) {
    local_608 = local_620;
    local_618 = local_628;
    local_638._0_4_ = cpp_dec_float_finite;
    local_638._4_4_ = 10;
    local_668 = (undefined1  [16])0x0;
    local_658 = (_func_int *)0x0;
    uStack_650._0_1_ = false;
    uStack_650._1_4_ = 0;
    uStack_64b = 0;
    local_648[0] = 0;
    local_648[1] = 0;
    local_648[2] = 0;
    local_63c = false;
    memset((DataKey *)local_4a8,0,0x100);
    LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::LPColBase((LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)local_5e8,
                (this->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thenum);
    local_4e0.m_elem =
         (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)0x0;
    local_4e0.memsize = 0;
    local_4e0.memused = 0;
    local_4e8 = (undefined1  [8])&PTR__DSVectorBase_006adc40;
    local_4d0 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x0;
    DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::allocMem((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)local_4e8,8);
    pcVar19 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
    local_550 = pcVar19->exp;
    local_54c = pcVar19->neg;
    local_548 = pcVar19->fpclass;
    iStack_544 = pcVar19->prec_elem;
    local_578 = *(_func_int ***)(pcVar19->data)._M_elems;
    iStack_570 = (pcVar19->data)._M_elems[2];
    iStack_56c = (pcVar19->data)._M_elems[3];
    local_568 = *(_func_int **)((pcVar19->data)._M_elems + 4);
    auStack_560 = *(uint (*) [2])((pcVar19->data)._M_elems + 6);
    local_558 = *(uint (*) [2])((pcVar19->data)._M_elems + 8);
    local_4e0.memused = 0;
    local_630 = *(SPxOut **)(in_FS_OFFSET + -8);
LAB_00220077:
    bVar14 = MPSInput::readLine((MPSInput *)local_390);
    if (bVar14) {
      if ((char *)local_268._0_8_ != (char *)0x0) {
        iVar15 = strcmp((char *)local_268._0_8_,"RHS");
        if (iVar15 == 0) {
          if (local_4a8[0] != '\0') {
            DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
            ::operator=((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                         *)local_540,&local_4e0);
            local_6a8._0_8_ = 0xffffffff00000000;
            LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::add(local_4c8,(DataKey *)local_6a8,
                  (LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)local_5e8);
          }
          local_390._8_4_ = RHS;
          goto LAB_00220645;
        }
        goto LAB_00220631;
      }
      if ((((char *)local_268._8_8_ == (char *)0x0) || ((char *)local_258._0_8_ == (char *)0x0)) ||
         ((char *)local_258._8_8_ == (char *)0x0)) goto LAB_00220631;
      iVar15 = strcmp((char *)local_4a8,(char *)local_268._8_8_);
      if (iVar15 != 0) {
        if (local_4a8[0] != '\0') {
          DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
          ::operator=((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                       *)local_540,&local_4e0);
          local_6a8._0_8_ = 0xffffffff00000000;
          LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::add(local_4c8,(DataKey *)local_6a8,
                (LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)local_5e8);
        }
        spxSnprintf((char *)local_4a8,0xff,"%s",local_268._8_8_);
        local_3a9 = 0;
        iVar15 = (local_618->set).thesize;
        NameSet::add(local_618,(char *)local_4a8);
        iVar16 = (local_618->set).thesize;
        if (iVar15 < iVar16) {
          local_4e0.memused = 0;
          pcVar19 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
          local_550 = pcVar19->exp;
          local_54c = pcVar19->neg;
          local_548 = pcVar19->fpclass;
          iStack_544 = pcVar19->prec_elem;
          local_578 = *(_func_int ***)(pcVar19->data)._M_elems;
          iStack_570 = (pcVar19->data)._M_elems[2];
          iStack_56c = (pcVar19->data)._M_elems[3];
          local_568 = *(_func_int **)((pcVar19->data)._M_elems + 4);
          auStack_560 = *(uint (*) [2])((pcVar19->data)._M_elems + 6);
          local_558 = *(uint (*) [2])((pcVar19->data)._M_elems + 8);
          pcVar19 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
          local_588 = pcVar19->exp;
          local_584 = pcVar19->neg;
          local_580._0_4_ = pcVar19->fpclass;
          local_580._4_4_ = pcVar19->prec_elem;
          local_5b0 = *(uint (*) [2])(pcVar19->data)._M_elems;
          auStack_5a8 = *(uint (*) [2])((pcVar19->data)._M_elems + 2);
          local_5a0 = *(uint (*) [2])((pcVar19->data)._M_elems + 4);
          auStack_598 = *(uint (*) [2])((pcVar19->data)._M_elems + 6);
          local_590 = *(uint (*) [2])((pcVar19->data)._M_elems + 8);
          ::soplex::infinity::__tls_init();
          local_678._0_4_ = cpp_dec_float_finite;
          local_678._4_4_ = 10;
          local_6a8 = ZEXT816(0);
          local_698 = (_func_int *)0x0;
          uStack_690._0_1_ = false;
          stack0xfffffffffffff971 = 0;
          uStack_68b = 0;
          _local_688 = 0;
          uStack_683 = 0;
          local_680 = 0;
          local_67c = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)local_6a8,(double)local_630);
          local_5c8 = (_func_int *)CONCAT35(uStack_683,_local_688);
          local_5d8 = local_698;
          uStack_5d0._0_1_ = uStack_690._0_1_;
          stack0xfffffffffffffa31 = stack0xfffffffffffff971;
          uStack_5cb = uStack_68b;
          local_5e8 = local_6a8;
          local_5c0 = local_680;
          local_5bc = local_67c;
          local_5b8._0_4_ = (fpclass_type)local_678;
          local_5b8._4_4_ = local_678._4_4_;
          if (local_38._0_1_ == true) {
            if (local_5f0 != (DIdxSet *)0x0) {
              i = NameSet::number(local_618,(char *)local_4a8);
              DIdxSet::addIdx(local_5f0,i);
            }
            pcVar19 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::one();
            local_5c0 = pcVar19->exp;
            local_5bc = pcVar19->neg;
            local_5e8 = *(undefined1 (*) [16])(pcVar19->data)._M_elems;
            local_5d8 = *(_func_int **)((pcVar19->data)._M_elems + 4);
            uVar6 = *(undefined8 *)((pcVar19->data)._M_elems + 6);
            local_5c8 = *(_func_int **)((pcVar19->data)._M_elems + 8);
            _uStack_5d0 = (undefined5)uVar6;
            uStack_5cb = (undefined3)((ulong)uVar6 >> 0x28);
            local_5b8._0_4_ = pcVar19->fpclass;
            local_5b8._4_4_ = pcVar19->prec_elem;
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "ERROR in COLUMNS: duplicate column name or not column-wise ordering",0x43);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x80);
          std::ostream::put(-0x80);
          std::ostream::flush();
        }
        if (iVar16 <= iVar15) goto LAB_00220631;
      }
      dVar24 = atof((char *)local_258._8_8_);
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)local_668,dVar24);
      uVar6 = local_258._0_8_;
      iVar15 = strcmp((char *)local_258._0_8_,local_138);
      auVar12 = local_668;
      if (iVar15 == 0) {
        local_558[0] = local_648[0];
        local_558[1] = local_648[1];
        auStack_560[1]._1_3_ = uStack_64b;
        auStack_560[0]._0_1_ = uStack_650._0_1_;
        auStack_560._1_4_ = uStack_650._1_4_;
        local_568 = local_658;
        local_578 = (_func_int **)local_668._0_8_;
        iStack_570 = local_668._8_4_;
        iStack_56c = local_668._12_4_;
        local_550 = local_648[2];
        local_54c = local_63c;
        local_548 = (fpclass_type)local_638;
        iStack_544 = local_638._4_4_;
        local_668 = auVar12;
      }
      else {
        iVar15 = NameSet::number(local_608,(char *)uVar6);
        if (iVar15 < 0) {
          MPSInput::entryIgnored
                    ((MPSInput *)local_390,"Column",(char *)local_268._8_8_,"row",
                     (char *)local_258._0_8_);
        }
        else {
          if ((fpclass_type)local_638 != cpp_dec_float_NaN) {
            local_678._0_4_ = cpp_dec_float_finite;
            local_678._4_4_ = 10;
            local_6a8 = (undefined1  [16])0x0;
            local_698 = (_func_int *)0x0;
            _uStack_690 = 0;
            uStack_68b = 0;
            _local_688 = 0;
            uStack_683 = 0;
            local_680 = 0;
            local_67c = false;
            pcVar19 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
            uVar6 = *(undefined8 *)((pcVar19->data)._M_elems + 8);
            _local_688 = (undefined5)uVar6;
            uStack_683 = (undefined3)((ulong)uVar6 >> 0x28);
            local_6a8 = *(undefined1 (*) [16])(pcVar19->data)._M_elems;
            local_698 = *(_func_int **)((pcVar19->data)._M_elems + 4);
            uVar6 = *(undefined8 *)((pcVar19->data)._M_elems + 6);
            _uStack_690 = (undefined5)uVar6;
            uStack_68b = (undefined3)((ulong)uVar6 >> 0x28);
            local_680 = pcVar19->exp;
            local_67c = pcVar19->neg;
            local_678._0_4_ = pcVar19->fpclass;
            local_678._4_4_ = pcVar19->prec_elem;
            iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)local_668,
                                (cpp_dec_float<50U,_int,_void> *)local_6a8);
            if (iVar16 == 0) goto LAB_002204b7;
          }
          DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::add((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)local_4e8,iVar15,
                (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)local_668);
        }
      }
LAB_002204b7:
      if ((char *)local_248._8_8_ != (char *)0x0) {
        dVar24 = atof((char *)local_248._8_8_);
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)local_668,dVar24);
        uVar6 = local_248._0_8_;
        iVar15 = strcmp((char *)local_248._0_8_,local_138);
        auVar12 = local_668;
        if (iVar15 == 0) {
          local_558[0] = local_648[0];
          local_558[1] = local_648[1];
          auStack_560[1]._1_3_ = uStack_64b;
          auStack_560[0]._0_1_ = uStack_650._0_1_;
          auStack_560._1_4_ = uStack_650._1_4_;
          local_568 = local_658;
          local_578 = (_func_int **)local_668._0_8_;
          iStack_570 = local_668._8_4_;
          iStack_56c = local_668._12_4_;
          local_550 = local_648[2];
          local_54c = local_63c;
          local_548 = (fpclass_type)local_638;
          iStack_544 = local_638._4_4_;
          local_668 = auVar12;
          goto LAB_00220077;
        }
        iVar15 = NameSet::number(local_608,(char *)uVar6);
        if (-1 < iVar15) {
          if ((fpclass_type)local_638 != cpp_dec_float_NaN) {
            local_678._0_4_ = cpp_dec_float_finite;
            local_678._4_4_ = 10;
            local_6a8 = (undefined1  [16])0x0;
            local_698 = (_func_int *)0x0;
            _uStack_690 = 0;
            uStack_68b = 0;
            _local_688 = 0;
            uStack_683 = 0;
            local_680 = 0;
            local_67c = false;
            pcVar19 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
            uVar6 = *(undefined8 *)((pcVar19->data)._M_elems + 8);
            _local_688 = (undefined5)uVar6;
            uStack_683 = (undefined3)((ulong)uVar6 >> 0x28);
            local_6a8 = *(undefined1 (*) [16])(pcVar19->data)._M_elems;
            local_698 = *(_func_int **)((pcVar19->data)._M_elems + 4);
            uVar6 = *(undefined8 *)((pcVar19->data)._M_elems + 6);
            _uStack_690 = (undefined5)uVar6;
            uStack_68b = (undefined3)((ulong)uVar6 >> 0x28);
            local_680 = pcVar19->exp;
            local_67c = pcVar19->neg;
            local_678._0_4_ = pcVar19->fpclass;
            local_678._4_4_ = pcVar19->prec_elem;
            iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)local_668,
                                (cpp_dec_float<50U,_int,_void> *)local_6a8);
            if (iVar16 == 0) goto LAB_00220077;
          }
          DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::add((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)local_4e8,iVar15,
                (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)local_668);
          goto LAB_00220077;
        }
        MPSInput::entryIgnored
                  ((MPSInput *)local_390,"Column",(char *)local_268._8_8_,"row",
                   (char *)local_248._0_8_);
      }
      goto LAB_00220077;
    }
LAB_00220631:
    MPSInput::syntaxError((MPSInput *)local_390);
LAB_00220645:
    local_4e8 = (undefined1  [8])&PTR__DSVectorBase_006adc40;
    if (local_4d0 !=
        (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *)0x0) {
      free(local_4d0);
      local_4d0 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x0;
    }
    local_540[0] = (_func_int **)&PTR__DSVectorBase_006adc40;
    if (local_528 !=
        (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *)0x0) {
      free(local_528);
      local_528 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x0;
    }
  }
  pNVar13 = local_620;
  if (local_390._8_4_ == RHS) {
    pSVar23 = this->spxout;
    memset((DataKey *)local_4a8,0,0x100);
    memset(local_5e8,0,0x100);
    local_678._0_4_ = cpp_dec_float_finite;
    local_678._4_4_ = 10;
    local_6a8 = (undefined1  [16])0x0;
    local_698 = (_func_int *)0x0;
    uStack_690._0_1_ = false;
    stack0xfffffffffffff971 = 0;
    uStack_68b = 0;
    _local_688 = 0;
    uStack_683 = 0;
    local_680 = 0;
    local_67c = false;
    bVar14 = MPSInput::readLine((MPSInput *)local_390);
    if (bVar14) {
      local_618 = *(NameSet **)(in_FS_OFFSET + -8);
      uStack_610 = 0;
      local_608 = (NameSet *)((ulong)local_618 ^ 0x8000000000000000);
      uStack_600 = 0x8000000000000000;
      while ((char *)local_268._0_8_ == (char *)0x0) {
        if ((((char *)local_258._0_8_ != (char *)0x0) && ((char *)local_258._8_8_ == (char *)0x0))
           || (((char *)local_248._0_8_ != (char *)0x0 && ((char *)local_248._8_8_ == (char *)0x0)))
           ) {
          MPSInput::insertName((MPSInput *)local_390,"_RHS_",false);
        }
        if ((((char *)local_268._8_8_ == (char *)0x0) || ((char *)local_258._0_8_ == (char *)0x0))
           || ((char *)local_258._8_8_ == (char *)0x0)) goto LAB_00220dfe;
        if (local_4a8[0] == '\0') {
          spxSnprintf((char *)local_4a8,0x100,"%s");
        }
        uVar6 = local_268._8_8_;
        iVar15 = strcmp((char *)local_4a8,(char *)local_268._8_8_);
        if (iVar15 == 0) {
          uVar17 = NameSet::number(pNVar13,(char *)local_258._0_8_);
          if ((int)uVar17 < 0) {
            MPSInput::entryIgnored
                      ((MPSInput *)local_390,"RHS",(char *)local_268._8_8_,"row",
                       (char *)local_258._0_8_);
          }
          else {
            dVar24 = atof((char *)local_258._8_8_);
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)local_6a8,dVar24);
            pcVar19 = &(this->
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).right.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar17].m_backend;
            ::soplex::infinity::__tls_init();
            local_638._0_4_ = cpp_dec_float_finite;
            local_638._4_4_ = 10;
            local_668 = (undefined1  [16])0x0;
            local_658 = (_func_int *)0x0;
            uStack_650._0_1_ = false;
            uStack_650._1_4_ = 0;
            uStack_64b = 0;
            local_648[0] = 0;
            local_648[1] = 0;
            local_648[2] = 0;
            local_63c = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)local_668,(double)local_618);
            if (((pcVar19->fpclass != cpp_dec_float_NaN) &&
                ((fpclass_type)local_638 != cpp_dec_float_NaN)) &&
               (iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (pcVar19,(cpp_dec_float<50U,_int,_void> *)local_668),
               auVar12 = local_6a8, local_6a8 = auVar12, iVar15 < 0)) {
              pnVar22 = (this->
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).right.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              *(ulong *)(pnVar22[uVar17].m_backend.data._M_elems + 8) =
                   CONCAT35(uStack_683,_local_688);
              puVar3 = pnVar22[uVar17].m_backend.data._M_elems + 4;
              *(_func_int **)puVar3 = local_698;
              *(ulong *)(puVar3 + 2) = CONCAT35(uStack_68b,_uStack_690);
              pDVar2 = (DataKey *)(pnVar22 + uVar17);
              pDVar2->info = local_6a8._0_4_;
              pDVar2->idx = local_6a8._4_4_;
              pDVar2[1].info = local_6a8._8_4_;
              pDVar2[1].idx = local_6a8._12_4_;
              pnVar22[uVar17].m_backend.exp = local_680;
              pnVar22[uVar17].m_backend.neg = local_67c;
              pnVar22[uVar17].m_backend.fpclass = (fpclass_type)local_678;
              pnVar22[uVar17].m_backend.prec_elem = local_678._4_4_;
            }
            pcVar19 = &(this->
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).left.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar17].m_backend;
            ::soplex::infinity::__tls_init();
            local_638._0_4_ = cpp_dec_float_finite;
            local_638._4_4_ = 10;
            local_668 = (undefined1  [16])0x0;
            local_658 = (_func_int *)0x0;
            uStack_650._0_1_ = false;
            uStack_650._1_4_ = 0;
            uStack_64b = 0;
            local_648[0] = 0;
            local_648[1] = 0;
            local_648[2] = 0;
            local_63c = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)local_668,(double)local_608);
            if (((pcVar19->fpclass != cpp_dec_float_NaN) &&
                ((fpclass_type)local_638 != cpp_dec_float_NaN)) &&
               (iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (pcVar19,(cpp_dec_float<50U,_int,_void> *)local_668),
               auVar12 = local_6a8, local_6a8 = auVar12, 0 < iVar15)) {
              pnVar22 = (this->
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).left.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              *(ulong *)(pnVar22[uVar17].m_backend.data._M_elems + 8) =
                   CONCAT35(uStack_683,_local_688);
              puVar3 = pnVar22[uVar17].m_backend.data._M_elems + 4;
              *(_func_int **)puVar3 = local_698;
              *(ulong *)(puVar3 + 2) = CONCAT35(uStack_68b,_uStack_690);
              pDVar2 = (DataKey *)(pnVar22 + uVar17);
              pDVar2->info = local_6a8._0_4_;
              pDVar2->idx = local_6a8._4_4_;
              pDVar2[1].info = local_6a8._8_4_;
              pDVar2[1].idx = local_6a8._12_4_;
              pnVar22[uVar17].m_backend.exp = local_680;
              pnVar22[uVar17].m_backend.neg = local_67c;
              pnVar22[uVar17].m_backend.fpclass = (fpclass_type)local_678;
              pnVar22[uVar17].m_backend.prec_elem = local_678._4_4_;
            }
          }
          if ((char *)local_248._8_8_ != (char *)0x0) {
            uVar17 = NameSet::number(pNVar13,(char *)local_248._0_8_);
            if ((int)uVar17 < 0) {
              MPSInput::entryIgnored
                        ((MPSInput *)local_390,"RHS",(char *)local_268._8_8_,"row",
                         (char *)local_248._0_8_);
            }
            else {
              dVar24 = atof((char *)local_248._8_8_);
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)local_6a8,dVar24);
              pcVar19 = &(this->
                         super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).right.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar17].m_backend;
              ::soplex::infinity::__tls_init();
              local_638._0_4_ = cpp_dec_float_finite;
              local_638._4_4_ = 10;
              local_668 = (undefined1  [16])0x0;
              local_658 = (_func_int *)0x0;
              uStack_650._0_1_ = false;
              uStack_650._1_4_ = 0;
              uStack_64b = 0;
              local_648[0] = 0;
              local_648[1] = 0;
              local_648[2] = 0;
              local_63c = false;
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)local_668,(double)local_618);
              if (((pcVar19->fpclass != cpp_dec_float_NaN) &&
                  ((fpclass_type)local_638 != cpp_dec_float_NaN)) &&
                 (iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     (pcVar19,(cpp_dec_float<50U,_int,_void> *)local_668),
                 auVar12 = local_6a8, local_6a8 = auVar12, iVar15 < 0)) {
                pnVar22 = (this->
                          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).right.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                *(ulong *)(pnVar22[uVar17].m_backend.data._M_elems + 8) =
                     CONCAT35(uStack_683,_local_688);
                puVar3 = pnVar22[uVar17].m_backend.data._M_elems + 4;
                *(_func_int **)puVar3 = local_698;
                *(ulong *)(puVar3 + 2) = CONCAT35(uStack_68b,_uStack_690);
                pDVar2 = (DataKey *)(pnVar22 + uVar17);
                pDVar2->info = local_6a8._0_4_;
                pDVar2->idx = local_6a8._4_4_;
                pDVar2[1].info = local_6a8._8_4_;
                pDVar2[1].idx = local_6a8._12_4_;
                pnVar22[uVar17].m_backend.exp = local_680;
                pnVar22[uVar17].m_backend.neg = local_67c;
                pnVar22[uVar17].m_backend.fpclass = (fpclass_type)local_678;
                pnVar22[uVar17].m_backend.prec_elem = local_678._4_4_;
              }
              pcVar19 = &(this->
                         super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).left.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar17].m_backend;
              ::soplex::infinity::__tls_init();
              local_638._0_4_ = cpp_dec_float_finite;
              local_638._4_4_ = 10;
              local_668 = (undefined1  [16])0x0;
              local_658 = (_func_int *)0x0;
              uStack_650._0_1_ = false;
              uStack_650._1_4_ = 0;
              uStack_64b = 0;
              local_648[0] = 0;
              local_648[1] = 0;
              local_648[2] = 0;
              local_63c = false;
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)local_668,(double)local_608);
              if (((pcVar19->fpclass != cpp_dec_float_NaN) &&
                  ((fpclass_type)local_638 != cpp_dec_float_NaN)) &&
                 (iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     (pcVar19,(cpp_dec_float<50U,_int,_void> *)local_668),
                 auVar12 = local_6a8, local_6a8 = auVar12, 0 < iVar15)) {
                pnVar22 = (this->
                          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).left.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                *(ulong *)(pnVar22[uVar17].m_backend.data._M_elems + 8) =
                     CONCAT35(uStack_683,_local_688);
                puVar3 = pnVar22[uVar17].m_backend.data._M_elems + 4;
                *(_func_int **)puVar3 = local_698;
                *(ulong *)(puVar3 + 2) = CONCAT35(uStack_68b,_uStack_690);
                pDVar2 = (DataKey *)(pnVar22 + uVar17);
                pDVar2->info = local_6a8._0_4_;
                pDVar2->idx = local_6a8._4_4_;
                pDVar2[1].info = local_6a8._8_4_;
                pDVar2[1].idx = local_6a8._12_4_;
                pnVar22[uVar17].m_backend.exp = local_680;
                pnVar22[uVar17].m_backend.neg = local_67c;
                pnVar22[uVar17].m_backend.fpclass = (fpclass_type)local_678;
                pnVar22[uVar17].m_backend.prec_elem = local_678._4_4_;
              }
            }
          }
        }
        else {
          iVar15 = strcmp(local_5e8,(char *)uVar6);
          if (((iVar15 != 0) && (spxSnprintf(local_5e8,0x100,"%s",uVar6), pSVar23 != (SPxOut *)0x0))
             && (4 < (int)pSVar23->m_verbosity)) {
            local_668._0_4_ = pSVar23->m_verbosity;
            local_4e8._0_4_ = 5;
            (*pSVar23->_vptr_SPxOut[2])(pSVar23,local_4e8);
            std::__ostream_insert<char,std::char_traits<char>>
                      (pSVar23->m_streams[pSVar23->m_verbosity],"IMPSRD07 RHS ignored    : ",0x1a);
            poVar7 = pSVar23->m_streams[pSVar23->m_verbosity];
            sVar20 = strlen(local_5e8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_5e8,sVar20);
            cVar5 = (char)pSVar23->m_streams[pSVar23->m_verbosity];
            std::ios::widen((char)*(undefined8 *)
                                   (*(long *)pSVar23->m_streams[pSVar23->m_verbosity] + -0x18) +
                            cVar5);
            std::ostream::put(cVar5);
            std::ostream::flush();
            (*pSVar23->_vptr_SPxOut[2])(pSVar23);
          }
        }
        bVar14 = MPSInput::readLine((MPSInput *)local_390);
        if (!bVar14) goto LAB_00220dfe;
      }
      if ((pSVar23 != (SPxOut *)0x0) && (3 < (int)pSVar23->m_verbosity)) {
        local_668._0_4_ = pSVar23->m_verbosity;
        local_4e8._0_4_ = 4;
        (*pSVar23->_vptr_SPxOut[2])(pSVar23);
        std::__ostream_insert<char,std::char_traits<char>>
                  (pSVar23->m_streams[pSVar23->m_verbosity],"IMPSRD03 RHS name       : ",0x1a);
        poVar7 = pSVar23->m_streams[pSVar23->m_verbosity];
        sVar20 = strlen((char *)local_4a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)local_4a8,sVar20);
        cVar5 = (char)pSVar23->m_streams[pSVar23->m_verbosity];
        std::ios::widen((char)*(undefined8 *)
                               (*(long *)pSVar23->m_streams[pSVar23->m_verbosity] + -0x18) + cVar5);
        std::ostream::put(cVar5);
        std::ostream::flush();
        (*pSVar23->_vptr_SPxOut[2])(pSVar23,local_668);
      }
      uVar6 = local_268._0_8_;
      iVar15 = strcmp((char *)local_268._0_8_,"RANGES");
      if (iVar15 == 0) {
        local_390._8_4_ = RANGES;
        goto LAB_00220e0b;
      }
      iVar15 = strcmp((char *)uVar6,"BOUNDS");
      if (iVar15 == 0) {
        local_390._8_4_ = BOUNDS;
        goto LAB_00220e0b;
      }
      iVar15 = strcmp((char *)uVar6,"ENDATA");
      if (iVar15 == 0) {
        local_390._8_4_ = ENDATA;
        goto LAB_00220e0b;
      }
    }
LAB_00220dfe:
    MPSInput::syntaxError((MPSInput *)local_390);
  }
LAB_00220e0b:
  if (local_390._8_4_ == RANGES) {
    local_608 = local_620;
    pSVar23 = this->spxout;
    memset((DataKey *)local_4a8,0,0x100);
    local_678._0_4_ = cpp_dec_float_finite;
    local_678._4_4_ = 10;
    local_6a8 = (undefined1  [16])0x0;
    local_698 = (_func_int *)0x0;
    uStack_690._0_1_ = false;
    stack0xfffffffffffff971 = 0;
    uStack_68b = 0;
    _local_688 = 0;
    uStack_683 = 0;
    local_680 = 0;
    local_67c = false;
    bVar14 = MPSInput::readLine((MPSInput *)local_390);
    local_4b0 = pSVar23;
    if (bVar14) {
      pVVar1 = &(this->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).left;
      local_3a8 = *(double *)(in_FS_OFFSET + -8);
      uStack_3a0 = 0;
      local_618 = (NameSet *)((ulong)local_3a8 ^ 0x8000000000000000);
      uStack_610 = 0x8000000000000000;
      local_630 = (SPxOut *)
                  &(this->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).right;
      while (pSVar23 = local_4b0, (char *)local_268._0_8_ == (char *)0x0) {
        if ((((char *)local_258._0_8_ != (char *)0x0) && ((char *)local_258._8_8_ == (char *)0x0))
           || (((char *)local_248._0_8_ != (char *)0x0 && ((char *)local_248._8_8_ == (char *)0x0)))
           ) {
          MPSInput::insertName((MPSInput *)local_390,"_RNG_",false);
        }
        if ((((char *)local_268._8_8_ == (char *)0x0) || ((char *)local_258._0_8_ == (char *)0x0))
           || ((char *)local_258._8_8_ == (char *)0x0)) goto LAB_002219e0;
        if (local_4a8[0] == '\0') {
          spxSnprintf((char *)local_4a8,0x100,"%s");
        }
        iVar15 = strcmp((char *)local_4a8,(char *)local_268._8_8_);
        if (iVar15 == 0) {
          uVar17 = NameSet::number(local_608,(char *)local_258._0_8_);
          if ((int)uVar17 < 0) {
            MPSInput::entryIgnored
                      ((MPSInput *)local_390,"Range",(char *)local_268._8_8_,"row",
                       (char *)local_258._0_8_);
          }
          else {
            dVar24 = atof((char *)local_258._8_8_);
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)local_6a8,dVar24);
            uVar21 = (ulong)uVar17;
            pcVar19 = &(pVVar1->val).
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar21].m_backend;
            ::soplex::infinity::__tls_init();
            local_5b8._0_4_ = cpp_dec_float_finite;
            local_5b8._4_4_ = 10;
            local_5e8 = (undefined1  [16])0x0;
            local_5d8 = (_func_int *)0x0;
            uStack_5d0._0_1_ = false;
            stack0xfffffffffffffa31 = 0;
            uStack_5cb = 0;
            local_5c8 = (_func_int *)0x0;
            local_5c0 = 0;
            local_5bc = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)local_5e8,(double)local_618);
            if (((pcVar19->fpclass != cpp_dec_float_NaN) &&
                ((fpclass_type)local_5b8 != cpp_dec_float_NaN)) &&
               (iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (pcVar19,(cpp_dec_float<50U,_int,_void> *)local_5e8), 0 < iVar15)
               ) {
              pp_Var8 = local_630->_vptr_SPxOut;
              ::soplex::infinity::__tls_init();
              local_638._0_4_ = cpp_dec_float_finite;
              local_638._4_4_ = 10;
              local_668 = (undefined1  [16])0x0;
              local_658 = (_func_int *)0x0;
              uStack_650._0_1_ = false;
              uStack_650._1_4_ = 0;
              uStack_64b = 0;
              local_648[0] = 0;
              local_648[1] = 0;
              local_648[2] = 0;
              local_63c = false;
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)local_668,local_3a8);
              if (((((cpp_dec_float<50U,_int,_void> *)(pp_Var8 + uVar21 * 7))->fpclass !=
                    cpp_dec_float_NaN) && ((fpclass_type)local_638 != cpp_dec_float_NaN)) &&
                 (iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     ((cpp_dec_float<50U,_int,_void> *)(pp_Var8 + uVar21 * 7),
                                      (cpp_dec_float<50U,_int,_void> *)local_668), iVar15 < 0)) {
                if ((fpclass_type)local_678 == cpp_dec_float_NaN) {
LAB_0022185d:
                  pSVar23 = (SPxOut *)pVVar1;
                }
                else {
                  local_5b8._0_4_ = cpp_dec_float_finite;
                  local_5b8._4_4_ = 10;
                  local_5e8 = (undefined1  [16])0x0;
                  local_5d8 = (_func_int *)0x0;
                  uStack_5d0._0_1_ = false;
                  stack0xfffffffffffffa31 = 0;
                  uStack_5cb = 0;
                  local_5c8 = (_func_int *)0x0;
                  local_5c0 = 0;
                  local_5bc = false;
                  iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     ((cpp_dec_float<50U,_int,_void> *)local_6a8,
                                      (cpp_dec_float<50U,_int,_void> *)local_5e8);
                  pSVar23 = local_630;
                  if (iVar15 < 0) goto LAB_0022185d;
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                          ((cpp_dec_float<50U,_int,_void> *)(pSVar23->_vptr_SPxOut + uVar21 * 7),
                           (cpp_dec_float<50U,_int,_void> *)local_6a8);
                goto LAB_002213cc;
              }
            }
            pcVar19 = &(pVVar1->val).
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar21].m_backend;
            ::soplex::infinity::__tls_init();
            local_5b8._0_4_ = cpp_dec_float_finite;
            local_5b8._4_4_ = 10;
            local_5e8 = (undefined1  [16])0x0;
            local_5d8 = (_func_int *)0x0;
            _uStack_5d0 = 0;
            uStack_5cb = 0;
            local_5c8 = (_func_int *)0x0;
            local_5c0 = 0;
            local_5bc = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)local_5e8,(double)local_618);
            if (((pcVar19->fpclass == cpp_dec_float_NaN) ||
                ((fpclass_type)local_5b8 == cpp_dec_float_NaN)) ||
               (iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (pcVar19,(cpp_dec_float<50U,_int,_void> *)local_5e8), iVar15 < 1)
               ) {
              pcVar19 = (cpp_dec_float<50U,_int,_void> *)(local_630->_vptr_SPxOut + uVar21 * 7);
              local_648[1]._1_3_ = uStack_683;
              local_648._0_5_ = _local_688;
              local_658 = local_698;
              uStack_650._0_1_ = uStack_690._0_1_;
              uStack_650._1_4_ = stack0xfffffffffffff971;
              uStack_64b = uStack_68b;
              local_668 = local_6a8;
              auVar12 = local_668;
              local_648[2] = local_680;
              local_63c = local_67c;
              local_638._0_4_ = (fpclass_type)local_678;
              local_638._4_4_ = local_678._4_4_;
              if ((local_67c == true) &&
                 (local_668._0_4_ = local_6a8._0_4_,
                 (fpclass_type)local_678 != cpp_dec_float_finite || local_668._0_4_ != 0)) {
                local_63c = false;
              }
              local_5b8._0_4_ = cpp_dec_float_finite;
              local_5b8._4_4_ = 10;
              local_5e8 = (undefined1  [16])0x0;
              local_5d8 = (_func_int *)0x0;
              uStack_5d0._0_1_ = false;
              stack0xfffffffffffffa31 = 0;
              uStack_5cb = 0;
              local_5c8 = (_func_int *)0x0;
              local_5c0 = 0;
              local_5bc = false;
              if ((cpp_dec_float<50U,_int,_void> *)local_5e8 != pcVar19) {
                local_5c8 = *(_func_int **)((pcVar19->data)._M_elems + 8);
                local_5e8 = *(undefined1 (*) [16])(pcVar19->data)._M_elems;
                local_5d8 = *(_func_int **)((pcVar19->data)._M_elems + 4);
                uVar6 = *(undefined8 *)((pcVar19->data)._M_elems + 6);
                _uStack_5d0 = (undefined5)uVar6;
                uStack_5cb = (undefined3)((ulong)uVar6 >> 0x28);
                local_5c0 = pcVar19->exp;
                local_5bc = pcVar19->neg;
                local_5b8._0_4_ = pcVar19->fpclass;
                local_5b8._4_4_ = pcVar19->prec_elem;
              }
              local_668 = auVar12;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        ((cpp_dec_float<50U,_int,_void> *)local_5e8,
                         (cpp_dec_float<50U,_int,_void> *)local_668);
              pnVar22 = (pVVar1->val).
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            }
            else {
              pcVar19 = &(pVVar1->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar21].m_backend;
              local_648[1]._1_3_ = uStack_683;
              local_648._0_5_ = _local_688;
              local_658 = local_698;
              uStack_650._0_1_ = uStack_690._0_1_;
              uStack_650._1_4_ = stack0xfffffffffffff971;
              uStack_64b = uStack_68b;
              local_668 = local_6a8;
              auVar12 = local_668;
              local_648[2] = local_680;
              local_63c = local_67c;
              local_638._0_4_ = (fpclass_type)local_678;
              local_638._4_4_ = local_678._4_4_;
              if ((local_67c == true) &&
                 (local_668._0_4_ = local_6a8._0_4_,
                 (fpclass_type)local_678 != cpp_dec_float_finite || local_668._0_4_ != 0)) {
                local_63c = false;
              }
              local_5b8._0_4_ = cpp_dec_float_finite;
              local_5b8._4_4_ = 10;
              local_5e8 = (undefined1  [16])0x0;
              local_5d8 = (_func_int *)0x0;
              uStack_5d0._0_1_ = false;
              stack0xfffffffffffffa31 = 0;
              uStack_5cb = 0;
              local_5c8 = (_func_int *)0x0;
              local_5c0 = 0;
              local_5bc = false;
              if ((cpp_dec_float<50U,_int,_void> *)local_5e8 != pcVar19) {
                local_5c8 = *(_func_int **)((pcVar19->data)._M_elems + 8);
                local_5e8 = *(undefined1 (*) [16])(pcVar19->data)._M_elems;
                local_5d8 = *(_func_int **)((pcVar19->data)._M_elems + 4);
                uVar6 = *(undefined8 *)((pcVar19->data)._M_elems + 6);
                _uStack_5d0 = (undefined5)uVar6;
                uStack_5cb = (undefined3)((ulong)uVar6 >> 0x28);
                local_5c0 = pcVar19->exp;
                local_5bc = pcVar19->neg;
                local_5b8._0_4_ = pcVar19->fpclass;
                local_5b8._4_4_ = pcVar19->prec_elem;
              }
              local_668 = auVar12;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        ((cpp_dec_float<50U,_int,_void> *)local_5e8,
                         (cpp_dec_float<50U,_int,_void> *)local_668);
              pnVar22 = (pointer)local_630->_vptr_SPxOut;
            }
            auVar12 = local_5e8;
            *(_func_int **)(pnVar22[uVar21].m_backend.data._M_elems + 8) = local_5c8;
            puVar3 = pnVar22[uVar21].m_backend.data._M_elems + 4;
            *(_func_int **)puVar3 = local_5d8;
            *(_func_int **)(puVar3 + 2) = (_func_int *)CONCAT35(uStack_5cb,_uStack_5d0);
            pDVar2 = (DataKey *)(pnVar22 + uVar21);
            pDVar2->info = local_5e8._0_4_;
            pDVar2->idx = local_5e8._4_4_;
            pDVar2[1].info = local_5e8._8_4_;
            pDVar2[1].idx = local_5e8._12_4_;
            pnVar22[uVar21].m_backend.exp = local_5c0;
            pnVar22[uVar21].m_backend.neg = local_5bc;
            pnVar22[uVar21].m_backend.fpclass = (fpclass_type)local_5b8;
            pnVar22[uVar21].m_backend.prec_elem = local_5b8._4_4_;
            local_5e8 = auVar12;
          }
LAB_002213cc:
          if ((char *)local_248._8_8_ != (char *)0x0) {
            uVar17 = NameSet::number(local_608,(char *)local_248._0_8_);
            if ((int)uVar17 < 0) {
              MPSInput::entryIgnored
                        ((MPSInput *)local_390,"Range",(char *)local_268._8_8_,"row",
                         (char *)local_248._0_8_);
            }
            else {
              dVar24 = atof((char *)local_248._8_8_);
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)local_6a8,dVar24);
              uVar21 = (ulong)uVar17;
              pcVar19 = &(pVVar1->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar21].m_backend;
              ::soplex::infinity::__tls_init();
              local_5b8._0_4_ = cpp_dec_float_finite;
              local_5b8._4_4_ = 10;
              local_5e8 = (undefined1  [16])0x0;
              local_5d8 = (_func_int *)0x0;
              uStack_5d0._0_1_ = false;
              stack0xfffffffffffffa31 = 0;
              uStack_5cb = 0;
              local_5c8 = (_func_int *)0x0;
              local_5c0 = 0;
              local_5bc = false;
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)local_5e8,(double)local_618);
              if (((pcVar19->fpclass != cpp_dec_float_NaN) &&
                  ((fpclass_type)local_5b8 != cpp_dec_float_NaN)) &&
                 (iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     (pcVar19,(cpp_dec_float<50U,_int,_void> *)local_5e8),
                 0 < iVar15)) {
                pp_Var8 = local_630->_vptr_SPxOut;
                ::soplex::infinity::__tls_init();
                local_638._0_4_ = cpp_dec_float_finite;
                local_638._4_4_ = 10;
                local_668 = (undefined1  [16])0x0;
                local_658 = (_func_int *)0x0;
                uStack_650._0_1_ = false;
                uStack_650._1_4_ = 0;
                uStack_64b = 0;
                local_648[0] = 0;
                local_648[1] = 0;
                local_648[2] = 0;
                local_63c = false;
                boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                          ((cpp_dec_float<50u,int,void> *)local_668,local_3a8);
                if (((((cpp_dec_float<50U,_int,_void> *)(pp_Var8 + uVar21 * 7))->fpclass !=
                      cpp_dec_float_NaN) && ((fpclass_type)local_638 != cpp_dec_float_NaN)) &&
                   (iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       ((cpp_dec_float<50U,_int,_void> *)(pp_Var8 + uVar21 * 7),
                                        (cpp_dec_float<50U,_int,_void> *)local_668), iVar15 < 0)) {
                  if ((fpclass_type)local_678 == cpp_dec_float_NaN) {
LAB_002218ce:
                    pSVar23 = (SPxOut *)pVVar1;
                  }
                  else {
                    local_5b8._0_4_ = cpp_dec_float_finite;
                    local_5b8._4_4_ = 10;
                    local_5e8 = (undefined1  [16])0x0;
                    local_5d8 = (_func_int *)0x0;
                    uStack_5d0._0_1_ = false;
                    stack0xfffffffffffffa31 = 0;
                    uStack_5cb = 0;
                    local_5c8 = (_func_int *)0x0;
                    local_5c0 = 0;
                    local_5bc = false;
                    iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       ((cpp_dec_float<50U,_int,_void> *)local_6a8,
                                        (cpp_dec_float<50U,_int,_void> *)local_5e8);
                    pSVar23 = local_630;
                    if (iVar15 < 0) goto LAB_002218ce;
                  }
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                            ((cpp_dec_float<50U,_int,_void> *)(pSVar23->_vptr_SPxOut + uVar21 * 7),
                             (cpp_dec_float<50U,_int,_void> *)local_6a8);
                  goto LAB_00220f96;
                }
              }
              pcVar19 = &(pVVar1->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar21].m_backend;
              ::soplex::infinity::__tls_init();
              local_5b8._0_4_ = cpp_dec_float_finite;
              local_5b8._4_4_ = 10;
              local_5e8 = (undefined1  [16])0x0;
              local_5d8 = (_func_int *)0x0;
              _uStack_5d0 = 0;
              uStack_5cb = 0;
              local_5c8 = (_func_int *)0x0;
              local_5c0 = 0;
              local_5bc = false;
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)local_5e8,(double)local_618);
              if (((pcVar19->fpclass == cpp_dec_float_NaN) ||
                  ((fpclass_type)local_5b8 == cpp_dec_float_NaN)) ||
                 (iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     (pcVar19,(cpp_dec_float<50U,_int,_void> *)local_5e8),
                 iVar15 < 1)) {
                pcVar19 = (cpp_dec_float<50U,_int,_void> *)(local_630->_vptr_SPxOut + uVar21 * 7);
                local_648[1]._1_3_ = uStack_683;
                local_648._0_5_ = _local_688;
                local_658 = local_698;
                uStack_650._0_1_ = uStack_690._0_1_;
                uStack_650._1_4_ = stack0xfffffffffffff971;
                uStack_64b = uStack_68b;
                local_668 = local_6a8;
                auVar12 = local_668;
                local_648[2] = local_680;
                local_63c = local_67c;
                local_638._0_4_ = (fpclass_type)local_678;
                local_638._4_4_ = local_678._4_4_;
                if ((local_67c == true) &&
                   (local_668._0_4_ = local_6a8._0_4_,
                   (fpclass_type)local_678 != cpp_dec_float_finite || local_668._0_4_ != 0)) {
                  local_63c = false;
                }
                local_5b8._0_4_ = cpp_dec_float_finite;
                local_5b8._4_4_ = 10;
                local_5e8 = (undefined1  [16])0x0;
                local_5d8 = (_func_int *)0x0;
                uStack_5d0._0_1_ = false;
                stack0xfffffffffffffa31 = 0;
                uStack_5cb = 0;
                local_5c8 = (_func_int *)0x0;
                local_5c0 = 0;
                local_5bc = false;
                if ((cpp_dec_float<50U,_int,_void> *)local_5e8 != pcVar19) {
                  local_5c8 = *(_func_int **)((pcVar19->data)._M_elems + 8);
                  local_5e8 = *(undefined1 (*) [16])(pcVar19->data)._M_elems;
                  local_5d8 = *(_func_int **)((pcVar19->data)._M_elems + 4);
                  uVar6 = *(undefined8 *)((pcVar19->data)._M_elems + 6);
                  _uStack_5d0 = (undefined5)uVar6;
                  uStack_5cb = (undefined3)((ulong)uVar6 >> 0x28);
                  local_5c0 = pcVar19->exp;
                  local_5bc = pcVar19->neg;
                  local_5b8._0_4_ = pcVar19->fpclass;
                  local_5b8._4_4_ = pcVar19->prec_elem;
                }
                local_668 = auVar12;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          ((cpp_dec_float<50U,_int,_void> *)local_5e8,
                           (cpp_dec_float<50U,_int,_void> *)local_668);
                pnVar22 = (pVVar1->val).
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
              }
              else {
                pcVar19 = &(pVVar1->val).
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar21].m_backend;
                local_648[1]._1_3_ = uStack_683;
                local_648._0_5_ = _local_688;
                local_658 = local_698;
                uStack_650._0_1_ = uStack_690._0_1_;
                uStack_650._1_4_ = stack0xfffffffffffff971;
                uStack_64b = uStack_68b;
                local_668 = local_6a8;
                auVar12 = local_668;
                local_648[2] = local_680;
                local_63c = local_67c;
                local_638._0_4_ = (fpclass_type)local_678;
                local_638._4_4_ = local_678._4_4_;
                if ((local_67c == true) &&
                   (local_668._0_4_ = local_6a8._0_4_,
                   (fpclass_type)local_678 != cpp_dec_float_finite || local_668._0_4_ != 0)) {
                  local_63c = false;
                }
                local_5b8._0_4_ = cpp_dec_float_finite;
                local_5b8._4_4_ = 10;
                local_5e8 = (undefined1  [16])0x0;
                local_5d8 = (_func_int *)0x0;
                uStack_5d0._0_1_ = false;
                stack0xfffffffffffffa31 = 0;
                uStack_5cb = 0;
                local_5c8 = (_func_int *)0x0;
                local_5c0 = 0;
                local_5bc = false;
                if ((cpp_dec_float<50U,_int,_void> *)local_5e8 != pcVar19) {
                  local_5c8 = *(_func_int **)((pcVar19->data)._M_elems + 8);
                  local_5e8 = *(undefined1 (*) [16])(pcVar19->data)._M_elems;
                  local_5d8 = *(_func_int **)((pcVar19->data)._M_elems + 4);
                  uVar6 = *(undefined8 *)((pcVar19->data)._M_elems + 6);
                  _uStack_5d0 = (undefined5)uVar6;
                  uStack_5cb = (undefined3)((ulong)uVar6 >> 0x28);
                  local_5c0 = pcVar19->exp;
                  local_5bc = pcVar19->neg;
                  local_5b8._0_4_ = pcVar19->fpclass;
                  local_5b8._4_4_ = pcVar19->prec_elem;
                }
                local_668 = auVar12;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                          ((cpp_dec_float<50U,_int,_void> *)local_5e8,
                           (cpp_dec_float<50U,_int,_void> *)local_668);
                pnVar22 = (pointer)local_630->_vptr_SPxOut;
              }
              auVar12 = local_5e8;
              *(_func_int **)(pnVar22[uVar21].m_backend.data._M_elems + 8) = local_5c8;
              puVar3 = pnVar22[uVar21].m_backend.data._M_elems + 4;
              *(_func_int **)puVar3 = local_5d8;
              *(_func_int **)(puVar3 + 2) = (_func_int *)CONCAT35(uStack_5cb,_uStack_5d0);
              pDVar2 = (DataKey *)(pnVar22 + uVar21);
              pDVar2->info = local_5e8._0_4_;
              pDVar2->idx = local_5e8._4_4_;
              pDVar2[1].info = local_5e8._8_4_;
              pDVar2[1].idx = local_5e8._12_4_;
              pnVar22[uVar21].m_backend.exp = local_5c0;
              pnVar22[uVar21].m_backend.neg = local_5bc;
              pnVar22[uVar21].m_backend.fpclass = (fpclass_type)local_5b8;
              pnVar22[uVar21].m_backend.prec_elem = local_5b8._4_4_;
              local_5e8 = auVar12;
            }
          }
        }
LAB_00220f96:
        bVar14 = MPSInput::readLine((MPSInput *)local_390);
        if (!bVar14) goto LAB_002219e0;
      }
      if ((local_4b0 != (SPxOut *)0x0) && (3 < (int)local_4b0->m_verbosity)) {
        local_5e8._0_4_ = local_4b0->m_verbosity;
        local_668._0_4_ = 4;
        (*local_4b0->_vptr_SPxOut[2])(local_4b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  (pSVar23->m_streams[pSVar23->m_verbosity],"IMPSRD04 Range name     : ",0x1a);
        poVar7 = pSVar23->m_streams[pSVar23->m_verbosity];
        sVar20 = strlen((char *)local_4a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)local_4a8,sVar20);
        cVar5 = (char)pSVar23->m_streams[pSVar23->m_verbosity];
        std::ios::widen((char)*(undefined8 *)
                               (*(long *)pSVar23->m_streams[pSVar23->m_verbosity] + -0x18) + cVar5);
        std::ostream::put(cVar5);
        std::ostream::flush();
        (*pSVar23->_vptr_SPxOut[2])(pSVar23,local_5e8);
      }
      uVar6 = local_268._0_8_;
      iVar15 = strcmp((char *)local_268._0_8_,"BOUNDS");
      if (iVar15 == 0) {
        local_390._8_4_ = BOUNDS;
        goto LAB_002219ed;
      }
      iVar15 = strcmp((char *)uVar6,"ENDATA");
      if (iVar15 == 0) {
        local_390._8_4_ = ENDATA;
        goto LAB_002219ed;
      }
    }
LAB_002219e0:
    MPSInput::syntaxError((MPSInput *)local_390);
  }
LAB_002219ed:
  pNVar13 = local_628;
  if (local_390._8_4_ == BOUNDS) {
    pSVar23 = this->spxout;
    DIdxSet::DIdxSet((DIdxSet *)local_668,8);
    memset((DataKey *)local_4a8,0,0x100);
    local_5b8._0_4_ = cpp_dec_float_finite;
    local_5b8._4_4_ = 10;
    local_5e8 = (undefined1  [16])0x0;
    local_5d8 = (_func_int *)0x0;
    uStack_5d0._0_1_ = false;
    stack0xfffffffffffffa31 = 0;
    uStack_5cb = 0;
    local_5c8 = (_func_int *)0x0;
    local_5c0 = 0;
    local_5bc = false;
    local_618 = *(NameSet **)(in_FS_OFFSET + -8);
    uStack_610 = 0;
    local_608 = (NameSet *)((ulong)local_618 ^ 0x8000000000000000);
    uStack_600 = 0x8000000000000000;
LAB_00221a8f:
    bVar14 = MPSInput::readLine((MPSInput *)local_390);
    if (bVar14) {
      if ((char *)local_268._0_8_ != (char *)0x0) {
        if ((pSVar23 != (SPxOut *)0x0) && (3 < (int)pSVar23->m_verbosity)) {
          local_6a8._0_4_ = pSVar23->m_verbosity;
          local_4e8._0_4_ = 4;
          (*pSVar23->_vptr_SPxOut[2])(pSVar23);
          std::__ostream_insert<char,std::char_traits<char>>
                    (pSVar23->m_streams[pSVar23->m_verbosity],"IMPSRD05 Bound name     : ",0x1a);
          poVar7 = pSVar23->m_streams[pSVar23->m_verbosity];
          sVar20 = strlen((char *)local_4a8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)local_4a8,sVar20);
          cVar5 = (char)pSVar23->m_streams[pSVar23->m_verbosity];
          std::ios::widen((char)*(undefined8 *)
                                 (*(long *)pSVar23->m_streams[pSVar23->m_verbosity] + -0x18) + cVar5
                         );
          std::ostream::put(cVar5);
          std::ostream::flush();
          (*pSVar23->_vptr_SPxOut[2])(pSVar23,local_6a8);
        }
        iVar15 = strcmp((char *)local_268._0_8_,"ENDATA");
        if (iVar15 == 0) {
          local_390._8_4_ = ENDATA;
          goto LAB_002223a1;
        }
        goto switchD_00221eea_caseD_4e;
      }
      uVar6 = local_268._8_8_;
      iVar15 = strcmp((char *)local_268._8_8_,"LO");
      if ((((iVar15 == 0) || (iVar15 = strcmp((char *)uVar6,"UP"), iVar15 == 0)) ||
          (iVar15 = strcmp((char *)uVar6,"FX"), iVar15 == 0)) ||
         ((iVar15 = strcmp((char *)uVar6,"LI"), iVar15 == 0 ||
          (iVar15 = strcmp((char *)uVar6,"UI"), iVar15 == 0)))) {
        if ((char *)local_258._8_8_ != (char *)0x0) {
          pcVar18 = (char *)local_248._0_8_;
          goto joined_r0x00221b41;
        }
      }
      else if ((char *)local_258._0_8_ != (char *)0x0) {
        pcVar18 = (char *)local_258._8_8_;
joined_r0x00221b41:
        if (pcVar18 == (char *)0x0) {
          MPSInput::insertName((MPSInput *)local_390,"_BND_",true);
        }
      }
      if ((((char *)local_268._8_8_ == (char *)0x0) || ((char *)local_258._0_8_ == (char *)0x0)) ||
         ((char *)local_258._8_8_ == (char *)0x0)) goto switchD_00221eea_caseD_4e;
      if (local_4a8[0] == '\0') {
        spxSnprintf((char *)local_4a8,0x100,"%s");
      }
      iVar15 = strcmp((char *)local_4a8,(char *)local_258._0_8_);
      if (iVar15 == 0) {
        uVar17 = NameSet::number(pNVar13,(char *)local_258._8_8_);
        if ((int)uVar17 < 0) {
          MPSInput::entryIgnored
                    ((MPSInput *)local_390,"column",(char *)local_258._8_8_,"bound",
                     (char *)local_4a8);
          goto LAB_00221a8f;
        }
        uVar6 = local_248._0_8_;
        if ((char *)local_248._0_8_ == (char *)0x0) {
          pcVar19 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
          local_5c8 = *(_func_int **)((pcVar19->data)._M_elems + 8);
          local_5e8 = *(undefined1 (*) [16])(pcVar19->data)._M_elems;
          local_5d8 = *(_func_int **)((pcVar19->data)._M_elems + 4);
          uVar6 = *(undefined8 *)((pcVar19->data)._M_elems + 6);
          _uStack_5d0 = (undefined5)uVar6;
          uStack_5cb = (undefined3)((ulong)uVar6 >> 0x28);
          local_5c0 = pcVar19->exp;
          local_5bc = pcVar19->neg;
          local_5b8._0_4_ = pcVar19->fpclass;
          local_5b8._4_4_ = pcVar19->prec_elem;
        }
        else {
          iVar15 = strcmp((char *)local_248._0_8_,"-Inf");
          if ((iVar15 == 0) || (iVar15 = strcmp((char *)uVar6,"-inf"), iVar15 == 0)) {
            ::soplex::infinity::__tls_init();
            local_678._0_4_ = cpp_dec_float_finite;
            local_678._4_4_ = 10;
            local_6a8 = (undefined1  [16])0x0;
            local_698 = (_func_int *)0x0;
            uStack_690._0_1_ = false;
            stack0xfffffffffffff971 = 0;
            uStack_68b = 0;
            _local_688 = 0;
            uStack_683 = 0;
            local_680 = 0;
            local_67c = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)local_6a8,(double)local_608);
          }
          else {
            iVar15 = strcmp((char *)uVar6,"Inf");
            if ((((iVar15 != 0) && (iVar15 = strcmp((char *)uVar6,"inf"), iVar15 != 0)) &&
                (iVar15 = strcmp((char *)uVar6,"+Inf"), iVar15 != 0)) &&
               (iVar15 = strcmp((char *)uVar6,"+inf"), iVar15 != 0)) {
              dVar24 = atof((char *)uVar6);
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)local_5e8,dVar24);
              goto LAB_00221df0;
            }
            ::soplex::infinity::__tls_init();
            local_678._0_4_ = cpp_dec_float_finite;
            local_678._4_4_ = 10;
            local_6a8 = (undefined1  [16])0x0;
            local_698 = (_func_int *)0x0;
            uStack_690._0_1_ = false;
            stack0xfffffffffffff971 = 0;
            uStack_68b = 0;
            _local_688 = 0;
            uStack_683 = 0;
            local_680 = 0;
            local_67c = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)local_6a8,(double)local_618);
          }
          local_5c8 = (_func_int *)CONCAT35(uStack_683,_local_688);
          local_5d8 = local_698;
          uStack_5d0._0_1_ = uStack_690._0_1_;
          stack0xfffffffffffffa31 = stack0xfffffffffffff971;
          uStack_5cb = uStack_68b;
          local_5e8 = local_6a8;
          local_5c0 = local_680;
          local_5bc = local_67c;
          local_5b8._0_4_ = (fpclass_type)local_678;
          local_5b8._4_4_ = local_678._4_4_;
        }
LAB_00221df0:
        if (*(char *)(local_268._8_8_ + 1) == 'I') {
          if (local_5f0 != (DIdxSet *)0x0) {
            DIdxSet::addIdx(local_5f0,uVar17);
          }
          iVar15 = IdxSet::pos((IdxSet *)local_668,uVar17);
          if (iVar15 < 0) {
            ::soplex::infinity::__tls_init();
            local_678._0_4_ = cpp_dec_float_finite;
            local_678._4_4_ = 10;
            local_6a8 = (undefined1  [16])0x0;
            local_698 = (_func_int *)0x0;
            uStack_690._0_1_ = false;
            stack0xfffffffffffff971 = 0;
            uStack_68b = 0;
            _local_688 = 0;
            uStack_683 = 0;
            local_680 = 0;
            local_67c = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)local_6a8,(double)local_618);
            auVar12 = local_6a8;
            pnVar22 = (this->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).up.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            *(ulong *)(pnVar22[uVar17].m_backend.data._M_elems + 8) =
                 CONCAT35(uStack_683,_local_688);
            puVar3 = pnVar22[uVar17].m_backend.data._M_elems + 4;
            *(_func_int **)puVar3 = local_698;
            *(ulong *)(puVar3 + 2) = CONCAT35(uStack_68b,_uStack_690);
            pDVar2 = (DataKey *)(pnVar22 + uVar17);
            pDVar2->info = local_6a8._0_4_;
            pDVar2->idx = local_6a8._4_4_;
            pDVar2[1].info = local_6a8._8_4_;
            pDVar2[1].idx = local_6a8._12_4_;
            pnVar22[uVar17].m_backend.exp = local_680;
            pnVar22[uVar17].m_backend.neg = local_67c;
            pnVar22[uVar17].m_backend.fpclass = (fpclass_type)local_678;
            pnVar22[uVar17].m_backend.prec_elem = local_678._4_4_;
            local_6a8 = auVar12;
            DIdxSet::addIdx((DIdxSet *)local_668,uVar17);
          }
        }
        auVar12 = local_5e8;
        cVar5 = *(char *)local_268._8_8_;
        switch(cVar5) {
        case 'L':
          pnVar22 = (this->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).low.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          break;
        case 'M':
          ::soplex::infinity::__tls_init();
          local_678._0_4_ = cpp_dec_float_finite;
          local_678._4_4_ = 10;
          local_6a8 = (undefined1  [16])0x0;
          local_698 = (_func_int *)0x0;
          uStack_690._0_1_ = false;
          stack0xfffffffffffff971 = 0;
          uStack_68b = 0;
          _local_688 = 0;
          uStack_683 = 0;
          local_680 = 0;
          local_67c = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)local_6a8,(double)local_608);
          pnVar22 = (this->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).low.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          goto LAB_00222085;
        case 'N':
        case 'O':
        case 'Q':
        case 'R':
        case 'S':
        case 'T':
          goto switchD_00221eea_caseD_4e;
        case 'P':
          ::soplex::infinity::__tls_init();
          local_678._0_4_ = cpp_dec_float_finite;
          local_678._4_4_ = 10;
          local_6a8 = (undefined1  [16])0x0;
          local_698 = (_func_int *)0x0;
          uStack_690._0_1_ = false;
          stack0xfffffffffffff971 = 0;
          uStack_68b = 0;
          _local_688 = 0;
          uStack_683 = 0;
          local_680 = 0;
          local_67c = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)local_6a8,(double)local_618);
          pnVar22 = (this->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).up.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
LAB_00222085:
          auVar12 = local_6a8;
          *(ulong *)(pnVar22[uVar17].m_backend.data._M_elems + 8) = CONCAT35(uStack_683,_local_688);
          puVar3 = pnVar22[uVar17].m_backend.data._M_elems + 4;
          *(_func_int **)puVar3 = local_698;
          *(ulong *)(puVar3 + 2) = CONCAT35(uStack_68b,_uStack_690);
          pDVar2 = (DataKey *)(pnVar22 + uVar17);
          pDVar2->info = local_6a8._0_4_;
          pDVar2->idx = local_6a8._4_4_;
          pDVar2[1].info = local_6a8._8_4_;
          pDVar2[1].idx = local_6a8._12_4_;
          pnVar22[uVar17].m_backend.exp = local_680;
          pnVar22[uVar17].m_backend.neg = local_67c;
          pnVar22[uVar17].m_backend.fpclass = (fpclass_type)local_678;
          pnVar22[uVar17].m_backend.prec_elem = local_678._4_4_;
          local_6a8 = auVar12;
          goto LAB_00221a8f;
        case 'U':
          pnVar22 = (this->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).up.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          break;
        default:
          if (cVar5 == 'B') {
            pnVar22 = (this->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).low.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pcVar19 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
            *(undefined8 *)(pnVar22[uVar17].m_backend.data._M_elems + 8) =
                 *(undefined8 *)((pcVar19->data)._M_elems + 8);
            uVar6 = *(undefined8 *)(pcVar19->data)._M_elems;
            uVar9 = *(undefined8 *)((pcVar19->data)._M_elems + 2);
            uVar10 = *(undefined8 *)((pcVar19->data)._M_elems + 6);
            puVar3 = pnVar22[uVar17].m_backend.data._M_elems + 4;
            *(undefined8 *)puVar3 = *(undefined8 *)((pcVar19->data)._M_elems + 4);
            *(undefined8 *)(puVar3 + 2) = uVar10;
            *(undefined8 *)&pnVar22[uVar17].m_backend.data = uVar6;
            *(undefined8 *)(pnVar22[uVar17].m_backend.data._M_elems + 2) = uVar9;
            pnVar22[uVar17].m_backend.exp = pcVar19->exp;
            pnVar22[uVar17].m_backend.neg = pcVar19->neg;
            iVar11 = pcVar19->prec_elem;
            pnVar22[uVar17].m_backend.fpclass = pcVar19->fpclass;
            pnVar22[uVar17].m_backend.prec_elem = iVar11;
            pnVar22 = (this->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).up.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pcVar19 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::one();
            *(undefined8 *)(pnVar22[uVar17].m_backend.data._M_elems + 8) =
                 *(undefined8 *)((pcVar19->data)._M_elems + 8);
            uVar9 = *(undefined8 *)(pcVar19->data)._M_elems;
            uVar10 = *(undefined8 *)((pcVar19->data)._M_elems + 2);
            uVar6 = *(undefined8 *)((pcVar19->data)._M_elems + 6);
            puVar3 = pnVar22[uVar17].m_backend.data._M_elems + 4;
            *(undefined8 *)puVar3 = *(undefined8 *)((pcVar19->data)._M_elems + 4);
            *(undefined8 *)(puVar3 + 2) = uVar6;
            *(undefined8 *)&pnVar22[uVar17].m_backend.data = uVar9;
            *(undefined8 *)(pnVar22[uVar17].m_backend.data._M_elems + 2) = uVar10;
            pnVar22[uVar17].m_backend.exp = pcVar19->exp;
            pnVar22[uVar17].m_backend.neg = pcVar19->neg;
            iVar11 = pcVar19->prec_elem;
            pnVar22[uVar17].m_backend.fpclass = pcVar19->fpclass;
            pnVar22[uVar17].m_backend.prec_elem = iVar11;
            if (local_5f0 != (DIdxSet *)0x0) {
              DIdxSet::addIdx(local_5f0,uVar17);
            }
            goto LAB_00221a8f;
          }
          if (cVar5 != 'F') goto switchD_00221eea_caseD_4e;
          if (*(char *)(local_268._8_8_ + 1) != 'X') {
            ::soplex::infinity::__tls_init();
            local_678._0_4_ = cpp_dec_float_finite;
            local_678._4_4_ = 10;
            local_6a8 = (undefined1  [16])0x0;
            local_698 = (_func_int *)0x0;
            _uStack_690 = 0;
            uStack_68b = 0;
            _local_688 = 0;
            uStack_683 = 0;
            local_680 = 0;
            local_67c = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)local_6a8,(double)local_608);
            auVar12 = local_6a8;
            pnVar22 = (this->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).low.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            *(ulong *)(pnVar22[uVar17].m_backend.data._M_elems + 8) =
                 CONCAT35(uStack_683,_local_688);
            puVar3 = pnVar22[uVar17].m_backend.data._M_elems + 4;
            *(_func_int **)puVar3 = local_698;
            *(ulong *)(puVar3 + 2) = CONCAT35(uStack_68b,_uStack_690);
            pDVar2 = (DataKey *)(pnVar22 + uVar17);
            pDVar2->info = local_6a8._0_4_;
            pDVar2->idx = local_6a8._4_4_;
            pDVar2[1].info = local_6a8._8_4_;
            pDVar2[1].idx = local_6a8._12_4_;
            pnVar22[uVar17].m_backend.exp = local_680;
            pnVar22[uVar17].m_backend.neg = local_67c;
            pnVar22[uVar17].m_backend.fpclass = (fpclass_type)local_678;
            pnVar22[uVar17].m_backend.prec_elem = local_678._4_4_;
            local_6a8 = auVar12;
            ::soplex::infinity::__tls_init();
            local_678._0_4_ = cpp_dec_float_finite;
            local_678._4_4_ = 10;
            local_6a8 = (undefined1  [16])0x0;
            local_698 = (_func_int *)0x0;
            uStack_690._0_1_ = false;
            stack0xfffffffffffff971 = 0;
            uStack_68b = 0;
            _local_688 = 0;
            uStack_683 = 0;
            local_680 = 0;
            local_67c = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)local_6a8,(double)local_618);
            auVar12 = local_6a8;
            pnVar22 = (this->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).up.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            *(ulong *)(pnVar22[uVar17].m_backend.data._M_elems + 8) =
                 CONCAT35(uStack_683,_local_688);
            puVar3 = pnVar22[uVar17].m_backend.data._M_elems + 4;
            *(_func_int **)puVar3 = local_698;
            *(ulong *)(puVar3 + 2) = CONCAT35(uStack_68b,_uStack_690);
            pDVar2 = (DataKey *)(pnVar22 + uVar17);
            pDVar2->info = local_6a8._0_4_;
            pDVar2->idx = local_6a8._4_4_;
            pDVar2[1].info = local_6a8._8_4_;
            pDVar2[1].idx = local_6a8._12_4_;
            pnVar22[uVar17].m_backend.exp = local_680;
            pnVar22[uVar17].m_backend.neg = local_67c;
            pnVar22[uVar17].m_backend.fpclass = (fpclass_type)local_678;
            pnVar22[uVar17].m_backend.prec_elem = local_678._4_4_;
            local_6a8 = auVar12;
            goto LAB_00221a8f;
          }
          pnVar22 = (this->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).low.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          *(_func_int **)(pnVar22[uVar17].m_backend.data._M_elems + 8) = local_5c8;
          puVar3 = pnVar22[uVar17].m_backend.data._M_elems + 4;
          *(_func_int **)puVar3 = local_5d8;
          *(ulong *)(puVar3 + 2) = CONCAT35(uStack_5cb,_uStack_5d0);
          pDVar2 = (DataKey *)(pnVar22 + uVar17);
          pDVar2->info = local_5e8._0_4_;
          pDVar2->idx = local_5e8._4_4_;
          pDVar2[1].info = local_5e8._8_4_;
          pDVar2[1].idx = local_5e8._12_4_;
          pnVar22[uVar17].m_backend.exp = local_5c0;
          pnVar22[uVar17].m_backend.neg = local_5bc;
          pnVar22[uVar17].m_backend.fpclass = (fpclass_type)local_5b8;
          pnVar22[uVar17].m_backend.prec_elem = local_5b8._4_4_;
          pnVar22 = (this->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).up.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        }
        *(_func_int **)(pnVar22[uVar17].m_backend.data._M_elems + 8) = local_5c8;
        puVar4 = (undefined8 *)(pnVar22[uVar17].m_backend.data._M_elems + 4);
        *puVar4 = local_5d8;
        puVar4[1] = CONCAT35(uStack_5cb,_uStack_5d0);
        pDVar2 = (DataKey *)(pnVar22 + uVar17);
        pDVar2->info = local_5e8._0_4_;
        pDVar2->idx = local_5e8._4_4_;
        pDVar2[1].info = local_5e8._8_4_;
        pDVar2[1].idx = local_5e8._12_4_;
        pnVar22[uVar17].m_backend.exp = local_5c0;
        pnVar22[uVar17].m_backend.neg = local_5bc;
        *(undefined8 *)&pnVar22[uVar17].m_backend.fpclass = local_5b8;
        local_5e8 = auVar12;
      }
      goto LAB_00221a8f;
    }
switchD_00221eea_caseD_4e:
    MPSInput::syntaxError((MPSInput *)local_390);
LAB_002223a1:
    DIdxSet::~DIdxSet((DIdxSet *)local_668);
  }
  if (local_390._8_4_ != ENDATA) {
    MPSInput::syntaxError((MPSInput *)local_390);
  }
  if ((bool)local_390[0x20] == true) {
    (*(this->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x1b])();
  }
  else {
    (*(this->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x45])
              (this,(ulong)(((local_390._28_4_ != MINIMIZE) - 1) +
                           (uint)(local_390._28_4_ != MINIMIZE)));
    pSVar23 = this->spxout;
    if ((pSVar23 != (SPxOut *)0x0) && (3 < (int)pSVar23->m_verbosity)) {
      local_4a8._0_4_ = pSVar23->m_verbosity;
      local_5e8._0_4_ = 4;
      (*pSVar23->_vptr_SPxOut[2])();
      pSVar23 = this->spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar23->m_streams[pSVar23->m_verbosity],"IMPSRD06 Objective sense: ",0x1a);
      pcVar18 = "Maximize\n";
      if (local_390._28_4_ == MINIMIZE) {
        pcVar18 = "Minimize\n";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar23->m_streams[pSVar23->m_verbosity],pcVar18,9);
      (*this->spxout->_vptr_SPxOut[2])(this->spxout,(DataKey *)local_4a8);
    }
    added2Set(this,(SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)this,
              &local_4c8->
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ,(this->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
    (*(this->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x51])
              (this,(ulong)(uint)(this->
                                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).
                                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 .set.thenum);
  }
  if (local_4c0 == (NameSet *)0x0) {
    NameSet::~NameSet(local_628);
    free(local_628);
    local_628 = (NameSet *)0x0;
  }
  if (local_4b8 == (NameSet *)0x0) {
    NameSet::~NameSet(local_620);
    free(local_620);
  }
  return (bool)(local_390[0x20] ^ 1);
}

Assistant:

inline
bool SPxLPBase<R>::readMPS(
   std::istream& p_input,           ///< input stream.
   NameSet*      p_rnames,          ///< row names.
   NameSet*      p_cnames,          ///< column names.
   DIdxSet*      p_intvars)         ///< integer variables.
{
   LPRowSetBase<R>& rset = *this;
   LPColSetBase<R>& cset = *this;
   NameSet* rnames;
   NameSet* cnames;

   if(p_cnames)
      cnames = p_cnames;
   else
   {
      cnames = nullptr;
      spx_alloc(cnames);
      cnames = new(cnames) NameSet();
   }

   cnames->clear();

   if(p_rnames)
      rnames = p_rnames;
   else
   {
      try
      {
         rnames = nullptr;
         spx_alloc(rnames);
         rnames = new(rnames) NameSet();
      }
      catch(const SPxMemoryException& x)
      {
         if(!p_cnames)
         {
            cnames->~NameSet();
            spx_free(cnames);
         }

         throw x;
      }
   }

   rnames->clear();

   SPxLPBase<R>::clear(); // clear the LP.

   cset.memRemax(Init_NZos);
   cset.reMax(Init_Cols);

   MPSInput mps(p_input);

   MPSreadName(mps, spxout);

   if(mps.section() == MPSInput::OBJSEN)
      MPSreadObjsen(mps);

   if(mps.section() == MPSInput::OBJNAME)
      MPSreadObjname(mps);

   if(mps.section() == MPSInput::ROWS)
      MPSreadRows(mps, rset, *rnames, spxout);

   addedRows(rset.num());

   if(mps.section() == MPSInput::COLUMNS)
      MPSreadCols(mps, rset, *rnames, cset, *cnames, p_intvars);

   if(mps.section() == MPSInput::RHS)
      MPSreadRhs(mps, rset, *rnames, spxout);

   if(mps.section() == MPSInput::RANGES)
      MPSreadRanges(mps, rset, *rnames, spxout);

   if(mps.section() == MPSInput::BOUNDS)
      MPSreadBounds(mps, cset, *cnames, p_intvars, spxout);

   if(mps.section() != MPSInput::ENDATA)
      mps.syntaxError();

   if(mps.hasError())
      clear();
   else
   {
      changeSense(mps.objSense() == MPSInput::MINIMIZE ? SPxLPBase<R>::MINIMIZE : SPxLPBase<R>::MAXIMIZE);

      SPX_MSG_INFO2((*spxout), (*spxout) << "IMPSRD06 Objective sense: " << ((mps.objSense() ==
                    MPSInput::MINIMIZE) ? "Minimize\n" : "Maximize\n"));

      added2Set(
         *(reinterpret_cast<SVSetBase<R>*>(static_cast<LPRowSetBase<R>*>(this))),
         *(reinterpret_cast<SVSetBase<R>*>(static_cast<LPColSetBase<R>*>(this))),
         cset.num());
      addedCols(cset.num());

      assert(isConsistent());
   }

   if(p_cnames == nullptr)
   {
      cnames->~NameSet();
      spx_free(cnames);
   }

   if(p_rnames == nullptr)
   {
      rnames->~NameSet();
      spx_free(rnames);
   }

   return !mps.hasError();
}